

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c++
# Opt level: O0

Maybe<unsigned_long> __thiscall kj::StringPtr::find(StringPtr *this,StringPtr *other)

{
  size_t sVar1;
  size_t sVar2;
  char *pcVar3;
  char *__needle;
  void *pvVar4;
  StringPtr *in_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_00;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_01;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_02;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 extraout_RDX_03;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar5;
  Maybe<unsigned_long> MVar6;
  unsigned_long local_48 [2];
  void *local_38;
  void *found;
  unsigned_long local_28;
  StringPtr *local_20;
  StringPtr *other_local;
  StringPtr *this_local;
  
  local_20 = in_RDX;
  other_local = other;
  this_local = this;
  sVar1 = size(in_RDX);
  if (sVar1 == 0) {
    local_28 = 0;
    Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)this,&local_28);
    aVar5 = extraout_RDX;
  }
  else {
    sVar1 = size(other);
    if (sVar1 == 0) {
      Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)this);
      aVar5 = extraout_RDX_00;
    }
    else {
      sVar1 = size(local_20);
      sVar2 = size(other);
      if (sVar2 < sVar1) {
        Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)this);
        aVar5 = extraout_RDX_01;
      }
      else {
        pcVar3 = begin(other);
        sVar1 = size(other);
        __needle = begin(local_20);
        sVar2 = size(local_20);
        pvVar4 = memmem(pcVar3,sVar1,__needle,sVar2);
        local_38 = pvVar4;
        if (pvVar4 == (void *)0x0) {
          Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)this);
          aVar5 = extraout_RDX_02;
        }
        else {
          pcVar3 = begin(other);
          local_48[0] = (long)pvVar4 - (long)pcVar3;
          Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)this,local_48);
          aVar5 = extraout_RDX_03;
        }
      }
    }
  }
  MVar6.ptr.field_1.value = aVar5.value;
  MVar6.ptr._0_8_ = this;
  return (Maybe<unsigned_long>)MVar6.ptr;
}

Assistant:

Maybe<size_t> StringPtr::find(const StringPtr& other) const {
  if (other.size() == 0) {
    return size_t(0);
  }
  if (size() == 0) {
    return kj::none;
  }
  if (other.size() > size()) {
    // We won't find the entirety of other if other is longer than this.
    return kj::none;
  }

#if !defined(_WIN32)
  void* found = memmem(begin(), size(), other.begin(), other.size());
  if (found == nullptr) {
    return kj::none;
  } else {
    return static_cast<char*>(found)-begin();
  }
#else
  // TODO(perf) This is O(len(this)*len(other)), which is very slow on big strings.
  //
  // On platforms that don't support memem, we should implement the Two-Way String-Matching
  // algorithm with linear performance.  The Two-Way String-Matching algorithm is described in
  // Crochemore and Perrin's CACM paper (Crochemore M., Perrin D., 1991, Two-way
  // string-matching, Journal of the ACM 38(3):651-675).
  //
  // * A scan of the original paper can be found at
  //   https://monge.univ-mlv.fr/~mac/Articles-PDF/CP-1991-jacm.pdf.
  //
  // * I find Python's implementation notes much easier to understand than the original paoer.
  //   https://github.com/python/cpython/blob/main/Objects/stringlib/stringlib_find_two_way_notes.txt
  //
  // * https://www-igm.univ-mlv.fr/~lecroq/string/node26.html#SECTION00260 has a description of
  //   the algorithm with some C code.
  for (size_t i = 0; i + other.size() <= size(); ++i) {
    if (slice(i).startsWith(other)) {
      return i;
    }
  }

  return kj::none;
#endif
}